

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

size_t __thiscall czh::file::StreamFile::get_arrowpos(StreamFile *this,size_t pos)

{
  basic_ifstream<char,_std::char_traits<char>_> *pbVar1;
  char cVar2;
  istream *piVar3;
  size_t sVar4;
  long lVar5;
  string tmp;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  pbVar1 = (this->file)._M_t.
           super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  std::ios::clear((int)pbVar1 + (int)*(undefined8 *)(*(long *)pbVar1 + -0x18));
  std::istream::seekg((this->file)._M_t.
                      super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,0,0);
  sVar4 = 0;
  lVar5 = 0;
  do {
    piVar3 = (istream *)
             (this->file)._M_t.
             super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
    cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar3 + -0x18) + (char)piVar3);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (piVar3,(string *)&local_50,cVar2);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
LAB_00119969:
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      return sVar4;
    }
    if (pos <= (ulong)(local_48 + lVar5)) {
      sVar4 = (pos - lVar5) + 1;
      goto LAB_00119969;
    }
    lVar5 = lVar5 + local_48 + 1;
  } while( true );
}

Assistant:

[[nodiscard]] std::size_t get_arrowpos(std::size_t pos) const override
    {
      std::size_t postmp = 0;
      std::string tmp;
      file->clear();
      file->seekg(std::ios::beg);
      while (std::getline(*file, tmp))
      {
        if (postmp + tmp.size() >= pos) return pos - postmp + 1;
        postmp += tmp.size() + 1;
      }
      return 0;
    }